

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O3

int nn_cinproc_create(void *hint,nn_epbase **epbase)

{
  nn_fsm_fn *self;
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  nn_fsm *self_00;
  nn_ctx *ctx;
  nn_sinproc *in_RCX;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar2;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint uVar3;
  int extraout_EDX_03;
  int iVar4;
  nn_epbase **ppnVar5;
  nn_fsm *owner;
  ulong uVar6;
  
  owner = (nn_fsm *)0x318;
  ppnVar5 = epbase;
  self_00 = (nn_fsm *)nn_alloc_(0x318);
  iVar4 = (int)ppnVar5;
  if (self_00 != (nn_fsm *)0x0) {
    self = &self_00[1].shutdown_fn;
    nn_ins_item_init((nn_ins_item *)self,&nn_cinproc_vfptr,hint);
    ctx = nn_epbase_getctx((nn_epbase *)self);
    nn_fsm_init_root(self_00,nn_cinproc_handler,nn_cinproc_shutdown,ctx);
    *(undefined4 *)&self_00[1].fn = 1;
    nn_sinproc_init((nn_sinproc *)&self_00[1].stopped,1,(nn_epbase *)self,self_00);
    nn_fsm_start(self_00);
    nn_ins_connect((nn_ins_item *)self,nn_cinproc_connect);
    *epbase = (nn_epbase *)self;
    return 0;
  }
  nn_cinproc_create_cold_1();
  iVar1 = *(int *)&owner[1].fn;
  uVar2 = extraout_EDX;
  if (iVar1 == 3) {
LAB_00128e72:
    if (iVar4 == 1) {
      if (uVar2 == 6) {
        *(undefined4 *)&owner[1].fn = 2;
        nn_epbase_stat_increment((nn_epbase *)&owner[1].shutdown_fn,0xca,1);
        nn_sinproc_init((nn_sinproc *)&owner[1].stopped,1,(nn_epbase *)&owner[1].shutdown_fn,owner);
        return extraout_EAX;
      }
    }
    else {
LAB_00128f0e:
      nn_cinproc_handler_cold_1();
LAB_00128f17:
      nn_cinproc_handler_cold_6();
    }
    nn_cinproc_handler_cold_2();
LAB_00128f27:
    nn_cinproc_handler_cold_7();
    uVar2 = extraout_EDX_01;
LAB_00128f2e:
    nn_cinproc_handler_cold_5();
    uVar3 = extraout_EDX_02;
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 != 1) {
        nn_cinproc_handler_cold_8();
        goto LAB_00128f0e;
      }
      if (iVar4 != -2) goto LAB_00128f17;
      if (extraout_EDX == 0xfffffffe) {
        *(undefined4 *)&owner[1].fn = 2;
        iVar4 = 0xca;
        goto LAB_00128ef8;
      }
      goto LAB_00128f27;
    }
    if (iVar4 != 0x6c41) {
      if (iVar4 == -2) {
        if (extraout_EDX != 1) {
          nn_cinproc_handler_cold_4();
          uVar2 = extraout_EDX_00;
          goto LAB_00128e72;
        }
LAB_00128ed3:
        *(undefined4 *)&owner[1].fn = 3;
        nn_epbase_stat_increment((nn_epbase *)&owner[1].shutdown_fn,0xca,-1);
        iVar4 = 0x65;
LAB_00128ef8:
        nn_epbase_stat_increment((nn_epbase *)&owner[1].shutdown_fn,iVar4,1);
        return extraout_EAX_00;
      }
      goto LAB_00128f2e;
    }
    uVar2 = 0x6c41;
    uVar3 = extraout_EDX;
    if (extraout_EDX == 1) {
      nn_sinproc_accept((nn_sinproc *)&owner[1].stopped,in_RCX);
      goto LAB_00128ed3;
    }
  }
  uVar6 = (ulong)uVar3;
  nn_cinproc_handler_cold_3();
  if (extraout_EDX_03 != -3 || uVar2 != 0xfffffffe) {
    if (*(int *)(uVar6 + 0x58) == 4) goto LAB_00128f65;
    nn_cinproc_shutdown_cold_1();
  }
  nn_cinproc_shutdown_cold_2();
LAB_00128f65:
  nn_cinproc_shutdown_cold_3();
  return extraout_EAX_01;
}

Assistant:

int nn_cinproc_create (void *hint, struct nn_epbase **epbase)
{
    struct nn_cinproc *self;

    self = nn_alloc (sizeof (struct nn_cinproc), "cinproc");
    alloc_assert (self);

    nn_ins_item_init (&self->item, &nn_cinproc_vfptr, hint);
    nn_fsm_init_root (&self->fsm, nn_cinproc_handler, nn_cinproc_shutdown,
        nn_epbase_getctx (&self->item.epbase));
    self->state = NN_CINPROC_STATE_IDLE;
    nn_sinproc_init (&self->sinproc, NN_CINPROC_SRC_SINPROC,
        &self->item.epbase, &self->fsm);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Register the inproc endpoint into a global repository. */
    nn_ins_connect (&self->item, nn_cinproc_connect);

    *epbase = &self->item.epbase;
    return 0;
}